

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
anon_unknown.dwarf_16c67c::CliqueRunner::unpermute
          (CliqueRunner *this,vector<int,_std::allocator<int>_> *v)

{
  bool bVar1;
  reference piVar2;
  undefined8 in_RDX;
  value_type_conflict1 *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int *w;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *result;
  vector<int,_std::allocator<int>_> *__lhs;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  __lhs = in_RDI;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a3683);
  local_28 = local_18;
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)__lhs,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_30);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x1c),(long)*piVar2);
    std::vector<int,_std::allocator<int>_>::push_back(in_stack_ffffffffffffffb0,in_RSI);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  }
  return __lhs;
}

Assistant:

auto unpermute(
            const vector<int> & v) -> vector<int>
        {
            vector<int> result;
            for (auto & w : v)
                result.push_back(order[w]);
            return result;
        }